

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

int hwnet::http::HttpSession::on_headers_complete(http_parser *parser)

{
  unsigned_short uVar1;
  ulong uVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  mapped_type *this;
  HttpRequest *this_00;
  HttpResponse *pHVar6;
  HttpPacket *this_01;
  undefined1 local_a0 [24];
  Ptr resp_1;
  shared_ptr<hwnet::http::HttpPacket> local_78;
  undefined1 local_68 [24];
  Ptr resp;
  shared_ptr<hwnet::http::HttpSession> local_38;
  undefined1 local_28 [8];
  Ptr req;
  HttpSession *session;
  http_parser *parser_local;
  
  req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parser->data;
  std::__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi[9]._M_use_count);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    peVar3 = std::
             __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&req.
                              super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi[9]._M_use_count);
    peVar4 = std::
             __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&req.
                              super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi[9]._M_use_count);
    peVar5 = std::
             __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&req.
                              super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi[9]._M_use_count);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar4->headers,&peVar5->field);
    std::__cxx11::string::operator=((string *)this,(string *)&peVar3->value);
    std::__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi[9]._M_use_count);
    std::__cxx11::string::clear();
    std::__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi[9]._M_use_count);
    std::__cxx11::string::clear();
  }
  uVar1 = parser->http_major;
  peVar3 = std::
           __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&req.
                          super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[9]._M_use_count);
  peVar3->http_major = uVar1;
  uVar1 = parser->http_minor;
  peVar3 = std::
           __shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&req.
                          super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[9]._M_use_count);
  peVar3->http_minor = uVar1;
  if (*(int *)&req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi[9]._vptr__Sp_counted_base == 2) {
    this_00 = (HttpRequest *)operator_new(0x30);
    resp.super___shared_ptr<hwnet::http::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._3_1_ = 1;
    std::shared_ptr<hwnet::http::HttpSession>::shared_ptr(&local_38,(nullptr_t)0x0);
    HttpRequest::HttpRequest
              (this_00,&local_38,
               (shared_ptr<hwnet::http::HttpPacket> *)
               &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[9]._M_use_count);
    resp.super___shared_ptr<hwnet::http::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._3_1_ = 0;
    std::shared_ptr<hwnet::http::HttpRequest>::shared_ptr<hwnet::http::HttpRequest,void>
              ((shared_ptr<hwnet::http::HttpRequest> *)local_28,this_00);
    std::shared_ptr<hwnet::http::HttpSession>::~shared_ptr(&local_38);
    pHVar6 = (HttpResponse *)operator_new(0x30);
    resp_1.super___shared_ptr<hwnet::http::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 1;
    my_shared_from_this((HttpSession *)local_68);
    this_01 = (HttpPacket *)operator_new(0xe0);
    HttpPacket::HttpPacket(this_01);
    std::shared_ptr<hwnet::http::HttpPacket>::shared_ptr<hwnet::http::HttpPacket,void>
              (&local_78,this_01);
    HttpResponse::HttpResponse(pHVar6,(shared_ptr<hwnet::http::HttpSession> *)local_68,&local_78);
    resp_1.super___shared_ptr<hwnet::http::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 0;
    std::shared_ptr<hwnet::http::HttpResponse>::shared_ptr<hwnet::http::HttpResponse,void>
              ((shared_ptr<hwnet::http::HttpResponse> *)(local_68 + 0x10),pHVar6);
    std::shared_ptr<hwnet::http::HttpPacket>::~shared_ptr(&local_78);
    std::shared_ptr<hwnet::http::HttpSession>::~shared_ptr
              ((shared_ptr<hwnet::http::HttpSession> *)local_68);
    std::
    function<void_(std::shared_ptr<hwnet::http::HttpRequest>_&,_std::shared_ptr<hwnet::http::HttpResponse>_&)>
    ::operator()((function<void_(std::shared_ptr<hwnet::http::HttpRequest>_&,_std::shared_ptr<hwnet::http::HttpResponse>_&)>
                  *)&req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi[10]._M_use_count,
                 (shared_ptr<hwnet::http::HttpRequest> *)local_28,
                 (shared_ptr<hwnet::http::HttpResponse> *)(local_68 + 0x10));
    std::shared_ptr<hwnet::http::HttpResponse>::~shared_ptr
              ((shared_ptr<hwnet::http::HttpResponse> *)(local_68 + 0x10));
    std::shared_ptr<hwnet::http::HttpRequest>::~shared_ptr
              ((shared_ptr<hwnet::http::HttpRequest> *)local_28);
  }
  else {
    pHVar6 = (HttpResponse *)operator_new(0x30);
    my_shared_from_this((HttpSession *)local_a0);
    HttpResponse::HttpResponse
              (pHVar6,(shared_ptr<hwnet::http::HttpSession> *)local_a0,
               (shared_ptr<hwnet::http::HttpPacket> *)
               &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[9]._M_use_count);
    std::shared_ptr<hwnet::http::HttpResponse>::shared_ptr<hwnet::http::HttpResponse,void>
              ((shared_ptr<hwnet::http::HttpResponse> *)(local_a0 + 0x10),pHVar6);
    std::shared_ptr<hwnet::http::HttpSession>::~shared_ptr
              ((shared_ptr<hwnet::http::HttpSession> *)local_a0);
    std::function<void_(std::shared_ptr<hwnet::http::HttpResponse>_&)>::operator()
              ((function<void_(std::shared_ptr<hwnet::http::HttpResponse>_&)> *)
               &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[0xc]._M_use_count,
               (shared_ptr<hwnet::http::HttpResponse> *)(local_a0 + 0x10));
    std::shared_ptr<hwnet::http::HttpResponse>::~shared_ptr
              ((shared_ptr<hwnet::http::HttpResponse> *)(local_a0 + 0x10));
  }
  return 0;
}

Assistant:

int HttpSession::on_headers_complete(http_parser *parser) {
	auto session = (HttpSession*)parser->data;
	if(!session->packet->field.empty()) {
		session->packet->headers[session->packet->field] = session->packet->value;
		session->packet->field.clear();
		session->packet->value.clear();
	}

	session->packet->http_major = parser->http_major;
	session->packet->http_minor = parser->http_minor;

	if(session->side == ServerSide) {
		auto req = HttpRequest::Ptr(new HttpRequest(nullptr,session->packet));
		auto resp = HttpResponse::Ptr(new HttpResponse(session->my_shared_from_this(),std::shared_ptr<HttpPacket>(new HttpPacket)));
		session->onRequest(req,resp);
	} else {
		auto resp = HttpResponse::Ptr(new HttpResponse(session->my_shared_from_this(),session->packet));
		session->onResponse(resp);		
	}
	
	return 0;
}